

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

int OpenSSLWrapper::SslServerContext::SNI_CB(SSL *ssl,char param_2,void *arg)

{
  char cVar1;
  SslContext *pSVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  char *__s;
  code *pcVar8;
  void *pvVar9;
  undefined8 *puVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  SSL_CTX *ctx;
  size_type sVar12;
  SslContext *this;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fnDomainCompare;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  string strHostName;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  __s = SSL_get_servername((SSL *)ssl,0);
  if (__s == (char *)0x0) {
    pcVar8 = (code *)SSL_get_ex_data((SSL *)ssl,0);
    pvVar9 = SSL_get_ex_data((SSL *)ssl,1);
    if (pvVar9 == (void *)0x0 || pcVar8 == (code *)0x0) {
      return 3;
    }
    puVar10 = (undefined8 *)(*pcVar8)(pvVar9);
    __s = (char *)*puVar10;
  }
  if (__s != (char *)0x0 && arg != (void *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strHostName,__s,(allocator<char> *)&fnDomainCompare);
    for (sVar12 = 0; strHostName._M_string_length != sVar12; sVar12 = sVar12 + 1) {
      iVar7 = tolower((int)strHostName._M_dataplus._M_p[sVar12]);
      strHostName._M_dataplus._M_p[sVar12] = (char)iVar7;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)&strHostName);
    fnDomainCompare.super__Function_base._M_manager = (_Manager_type)0x0;
    fnDomainCompare._M_invoker = (_Invoker_type)0x0;
    fnDomainCompare.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    fnDomainCompare.super__Function_base._M_functor._8_8_ = 0;
    fnDomainCompare.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
    uVar4 = local_90._8_8_;
    *(code **)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ =
         (code *)((long)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ + 0x10);
    if ((_AutomatonPtr *)local_90._0_8_ == &local_90._M_automaton) {
      *(ulong *)((long)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
           CONCAT71(local_90._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._1_7_,
                    local_90._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_1_);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
           local_90._M_automaton.
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      *(undefined8 *)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ =
           local_90._0_8_;
      *(ulong *)((long)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
           CONCAT71(local_90._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._1_7_,
                    local_90._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_1_);
    }
    local_90._M_loc = (locale_type)0x0;
    local_90._9_7_ = 0;
    *(undefined8 *)((long)fnDomainCompare.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         uVar4;
    local_90._M_automaton.
    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ = 0;
    fnDomainCompare._M_invoker =
         std::
         _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:448:55)>
         ::_M_invoke;
    fnDomainCompare.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:448:55)>
         ::_M_manager;
    local_90._0_8_ = &local_90._M_automaton;
    std::__cxx11::string::~string((string *)&local_90);
    pSVar2 = *(SslContext **)((long)arg + 8);
    for (this = *arg; this != pSVar2;
        this = (SslContext *)&this[1].m_strCertComName._M_string_length) {
      cVar1 = *(this->m_strCertComName)._M_dataplus._M_p;
      if (cVar1 == '^') {
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_90,
                   &this->m_strCertComName,0x10);
        bVar5 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&strHostName,&local_90,0);
        if (!bVar5) goto LAB_0011df21;
LAB_0011dfa2:
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
LAB_0011dfac:
        ctx = (SSL_CTX *)SslContext::operator()(this);
        SSL_set_SSL_CTX((SSL *)ssl,ctx);
        std::_Function_base::~_Function_base(&fnDomainCompare.super__Function_base);
        std::__cxx11::string::~string((string *)&strHostName);
        return 0;
      }
LAB_0011df21:
      _Var6 = std::operator==(&this->m_strCertComName,&strHostName);
      if (_Var6) {
        if (cVar1 != '^') goto LAB_0011dfac;
        goto LAB_0011dfa2;
      }
      _Var11._M_current =
           (this->m_vstrAltNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->m_vstrAltNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::
      function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(&local_50,&fnDomainCompare);
      _Var11 = std::
               find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string&)>>
                         (_Var11,__last,&local_50);
      pbVar3 = (this->m_vstrAltNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      if (cVar1 == '^') {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
      }
      if (_Var11._M_current != pbVar3) goto LAB_0011dfac;
    }
    std::_Function_base::~_Function_base(&fnDomainCompare.super__Function_base);
    std::__cxx11::string::~string((string *)&strHostName);
  }
  return 3;
}

Assistant:

int SslServerContext::SNI_CB(SSL* ssl, char /*iCmd*/, void* arg)
    {
        vector<SslServerContext>* pSslCtx = static_cast<vector<SslServerContext>*>(arg);

        const char* szHostName = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);

        if (szHostName == nullptr)  // if the host name is not set, the connection was made by IP address, we use the IP of the interface the connection came in, to find the certificate
        {
            const string& (*fnForwarder)(void*) = reinterpret_cast<const string&(*)(void*)>(SSL_get_ex_data(ssl, 0));   // Index 0 = Funktion pointer to a static proxy function
            void* Obj = SSL_get_ex_data(ssl, 1);    // Index 1 is the "this" pointer of the SslTcpSocket how owns the ssl object
            if (fnForwarder != nullptr && Obj != nullptr)
                szHostName = fnForwarder(Obj).c_str(); // We get the IP address of the Interface the connection come in
        }

        if (pSslCtx != nullptr && szHostName != nullptr)
        {
            string strHostName(szHostName);
            transform(begin(strHostName), end(strHostName), begin(strHostName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            function<bool(string&)> fnDomainCompare = [strHostName](string& it) -> bool
            {
                if (it[0] == '^')   // we have a regular expression
                    return regex_match(strHostName, regex(it));
                else
                    return it.compare(strHostName) == 0 ? true : false;
            };

            for (auto& it : *pSslCtx)
            {
                if ((it.m_strCertComName[0] == '^' && regex_match(strHostName, regex(it.m_strCertComName))) || it.m_strCertComName == strHostName || find_if(begin(it.m_vstrAltNames), end(it.m_vstrAltNames), fnDomainCompare) != end(it.m_vstrAltNames))
                {
                    SSL_set_SSL_CTX(ssl, it());
                    return SSL_TLSEXT_ERR_OK;
                }
            }
        }

        return SSL_TLSEXT_ERR_NOACK;
    }